

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O1

int __thiscall asmjit::v1_14::VirtMem::AnonymousMemory::unlink(AnonymousMemory *this,char *__name)

{
  FileType FVar1;
  int in_EAX;
  int iVar2;
  char *pcVar3;
  
  FVar1 = this->_fileType;
  this->_fileType = kFileTypeNone;
  if (FVar1 != kFileTypeTmp) {
    if (FVar1 == kFileTypeShm) {
      if ((byte)this->_tmpName < 0x1f) {
        pcVar3 = &this->field_0x9;
      }
      else {
        pcVar3 = *(char **)&this->field_0x20;
      }
      shm_unlink(pcVar3);
    }
    return in_EAX;
  }
  if ((byte)this->_tmpName < 0x1f) {
    pcVar3 = &this->field_0x9;
  }
  else {
    pcVar3 = *(char **)&this->field_0x20;
  }
  iVar2 = ::unlink(pcVar3);
  return iVar2;
}

Assistant:

void unlink() noexcept {
    FileType type = _fileType;
    _fileType = kFileTypeNone;

#ifdef ASMJIT_HAS_SHM_OPEN
    if (type == kFileTypeShm) {
      ::shm_unlink(_tmpName.data());
      return;
    }
#endif

    if (type == kFileTypeTmp) {
      ::unlink(_tmpName.data());
      return;
    }
  }